

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O1

void __thiscall boost::detail::shared_count::~shared_count(shared_count *this)

{
  uint_least32_t *puVar1;
  sp_counted_base *psVar2;
  
  psVar2 = this->pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    puVar1 = &psVar2->use_count_;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if (*puVar1 == 0) {
      (*psVar2->_vptr_sp_counted_base[2])(psVar2);
      LOCK();
      puVar1 = &psVar2->weak_count_;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if (*puVar1 == 0) {
        (*psVar2->_vptr_sp_counted_base[3])(psVar2);
      }
    }
  }
  return;
}

Assistant:

~shared_count() /*BOOST_SP_NOEXCEPT*/
    {
        if( pi_ != 0 ) pi_->release();
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        id_ = 0;
#endif
    }